

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcol.c
# Opt level: O1

int ffgpf(fitsfile *fptr,int datatype,LONGLONG firstelem,LONGLONG nelem,void *array,char *nullarray,
         int *anynul,int *status)

{
  if (nelem == 0 || 0 < *status) {
    return *status;
  }
  if (datatype < 0x28) {
    if (datatype < 0x15) {
      if (datatype == 0xb) {
        ffgpfb(fptr,1,firstelem,nelem,(uchar *)array,nullarray,anynul,status);
        goto LAB_00189c36;
      }
      if (datatype == 0xc) {
        ffgpfsb(fptr,1,firstelem,nelem,(char *)array,nullarray,anynul,status);
        goto LAB_00189c36;
      }
      if (datatype == 0x14) {
        ffgpfui(fptr,1,firstelem,nelem,(unsigned_short *)array,nullarray,anynul,status);
        goto LAB_00189c36;
      }
    }
    else {
      if (datatype == 0x15) {
        ffgpfi(fptr,1,firstelem,nelem,(short *)array,nullarray,anynul,status);
        goto LAB_00189c36;
      }
      if (datatype == 0x1e) {
        ffgpfuk(fptr,1,firstelem,nelem,(uint *)array,nullarray,anynul,status);
        goto LAB_00189c36;
      }
      if (datatype == 0x1f) {
        ffgpfk(fptr,1,firstelem,nelem,(int *)array,nullarray,anynul,status);
        goto LAB_00189c36;
      }
    }
  }
  else if (datatype < 0x50) {
    if (datatype == 0x28) {
      ffgpfuj(fptr,1,firstelem,nelem,(unsigned_long *)array,nullarray,anynul,status);
      goto LAB_00189c36;
    }
    if (datatype == 0x29) {
      ffgpfj(fptr,1,firstelem,nelem,(long *)array,nullarray,anynul,status);
      goto LAB_00189c36;
    }
    if (datatype == 0x2a) {
      ffgpfe(fptr,1,firstelem,nelem,(float *)array,nullarray,anynul,status);
      goto LAB_00189c36;
    }
  }
  else {
    if (datatype == 0x50) {
      ffgpfujj(fptr,1,firstelem,nelem,(ULONGLONG *)array,nullarray,anynul,status);
      goto LAB_00189c36;
    }
    if (datatype == 0x51) {
      ffgpfjj(fptr,1,firstelem,nelem,(LONGLONG *)array,nullarray,anynul,status);
      goto LAB_00189c36;
    }
    if (datatype == 0x52) {
      ffgpfd(fptr,1,firstelem,nelem,(double *)array,nullarray,anynul,status);
      goto LAB_00189c36;
    }
  }
  *status = 0x19a;
LAB_00189c36:
  return *status;
}

Assistant:

int ffgpf(  fitsfile *fptr,   /* I - FITS file pointer                       */
            int  datatype,    /* I - datatype of the value                   */
            LONGLONG firstelem,   /* I - first vector element to read (1 = 1st)  */
            LONGLONG nelem,       /* I - number of values to read                */
            void *array,      /* O - array of values that are returned       */
            char *nullarray,  /* O - array of null value flags               */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from the primary array. The datatype of the
  input array is defined by the 2nd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  The nullarray values will = 1 if the corresponding array value is null.
  ANYNUL is returned with a value of .true. if any pixels are undefined.
*/
{

    if (*status > 0 || nelem == 0)   /* inherit input status value if > 0 */
        return(*status);

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    if (datatype == TBYTE)
    {
        ffgpfb(fptr, 1, firstelem, nelem, 
               (unsigned char *) array, nullarray, anynul, status);
    }
    else if (datatype == TSBYTE)
    {
        ffgpfsb(fptr, 1, firstelem, nelem, 
               (signed char *) array, nullarray, anynul, status);
    }
    else if (datatype == TUSHORT)
    {
        ffgpfui(fptr, 1, firstelem, nelem, 
               (unsigned short *) array, nullarray, anynul, status);
    }
    else if (datatype == TSHORT)
    {
        ffgpfi(fptr, 1, firstelem, nelem, 
               (short *) array, nullarray, anynul, status);
    }
    else if (datatype == TUINT)
    {
        ffgpfuk(fptr, 1, firstelem, nelem, 
               (unsigned int *) array, nullarray, anynul, status);
    }
    else if (datatype == TINT)
    {
        ffgpfk(fptr, 1, firstelem, nelem, 
               (int *) array, nullarray, anynul, status);
    }
    else if (datatype == TULONG)
    {
        ffgpfuj(fptr, 1, firstelem, nelem, 
               (unsigned long *) array, nullarray, anynul, status);
    }
    else if (datatype == TLONG)
    {
        ffgpfj(fptr, 1, firstelem, nelem,
               (long *) array, nullarray, anynul, status);
    }
    else if (datatype == TULONGLONG)
    {
        ffgpfujj(fptr, 1, firstelem, nelem,
               (ULONGLONG *) array, nullarray, anynul, status);
    }
    else if (datatype == TLONGLONG)
    {
        ffgpfjj(fptr, 1, firstelem, nelem,
               (LONGLONG *) array, nullarray, anynul, status);
    }
    else if (datatype == TFLOAT)
    {
        ffgpfe(fptr, 1, firstelem, nelem, 
               (float *) array, nullarray, anynul, status);
    }
    else if (datatype == TDOUBLE)
    {
        ffgpfd(fptr, 1, firstelem, nelem,
               (double *) array, nullarray, anynul, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}